

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigUnfold2.c
# Opt level: O3

void Saig_ManFilterUsingInd2(Aig_Man_t *p,Vec_Vec_t *vCands,int nConfs,int nProps,int fVerbose)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  Aig_Man_t *p_00;
  Aig_Man_t *p_01;
  sat_solver *pSat;
  void **ppvVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  char *pcVar9;
  Aig_Man_t *__ptr;
  int in_R9D;
  int *piVar10;
  Vec_Ptr_t *pVVar11;
  int Counter;
  uint local_74;
  int local_64;
  
  p_00 = Saig_ManCreateIndMiter2(p,vCands);
  if ((long)vCands->nSize < 1) {
    iVar8 = 0;
  }
  else {
    lVar6 = 0;
    iVar8 = 0;
    do {
      iVar8 = iVar8 + *(int *)((long)vCands->pArray[lVar6] + 4);
      lVar6 = lVar6 + 1;
    } while (vCands->nSize != lVar6);
    iVar8 = iVar8 * 3;
  }
  if (p_00->nObjs[3] != iVar8) {
    __assert_fail("Aig_ManCoNum(pFrames) == Vec_VecSizeSize(vCands)*3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigUnfold2.c"
                  ,0x89,"void Saig_ManFilterUsingInd2(Aig_Man_t *, Vec_Vec_t *, int, int, int)");
  }
  p_01 = (Aig_Man_t *)Cnf_DeriveSimple(p_00,p_00->nObjs[3]);
  pcVar9 = (char *)p_01;
  pSat = (sat_solver *)Cnf_DataWriteIntoSolver((Cnf_Dat_t *)p_01,1,0);
  if (fVerbose != 0) {
    pcVar9 = "Filtered cands:  ";
    puts("Filtered cands:  ");
  }
  if (0 < vCands->nSize) {
    bVar4 = true;
    local_64 = 0;
    lVar6 = 0;
    do {
      if (!bVar4) {
        __assert_fail("i==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigUnfold2.c"
                      ,0x93,"void Saig_ManFilterUsingInd2(Aig_Man_t *, Vec_Vec_t *, int, int, int)")
        ;
      }
      pvVar2 = vCands->pArray[lVar6];
      iVar8 = *(int *)((long)pvVar2 + 4);
      if (iVar8 < 1) {
        local_74 = 0;
      }
      else {
        lVar6 = 0;
        local_74 = 0;
        do {
          Counter = local_64 + (int)lVar6;
          pvVar3 = *(void **)(*(long *)((long)pvVar2 + 8) + lVar6 * 8);
          iVar8 = Saig_ManFilterUsingIndOne2
                            ((Aig_Man_t *)pcVar9,p_00,pSat,(Cnf_Dat_t *)p_01,nConfs,in_R9D,Counter,0
                            );
          if (iVar8 == -1) {
            if (((int)local_74 < 0) || (*(int *)((long)pvVar2 + 4) <= (int)local_74)) {
LAB_00625764:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            *(void **)(*(long *)((long)pvVar2 + 8) + (ulong)local_74 * 8) = pvVar3;
            if (fVerbose != 0) {
              pcVar9 = "!";
              if (((ulong)pvVar3 & 1) == 0) {
                pcVar9 = "";
              }
              printf("%d:%s%d \n",0,pcVar9,
                     (ulong)*(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 0x24));
            }
            pcVar7 = "!";
            if (((ulong)pvVar3 & 1) == 0) {
              pcVar7 = "";
            }
            pcVar9 = " type I : %d:%s%d \n";
            printf(" type I : %d:%s%d \n",0,pcVar7,
                   (ulong)*(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 0x24));
            pVVar11 = p->unfold2_type_I;
            piVar10 = &pVVar11->nSize;
            uVar1 = pVVar11->nSize;
            if (uVar1 == pVVar11->nCap) {
LAB_00625663:
              if ((int)uVar1 < 0x10) {
                pcVar9 = (char *)pVVar11->pArray;
                if ((Aig_Man_t *)pcVar9 == (Aig_Man_t *)0x0) {
                  pcVar9 = (char *)0x80;
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(pcVar9,0x80);
                }
                pVVar11->pArray = ppvVar5;
                pVVar11->nCap = 0x10;
              }
              else {
                __ptr = (Aig_Man_t *)pVVar11->pArray;
                pcVar9 = (char *)((ulong)uVar1 << 4);
                if (__ptr == (Aig_Man_t *)0x0) {
                  ppvVar5 = (void **)malloc((size_t)pcVar9);
                }
                else {
                  ppvVar5 = (void **)realloc(__ptr,(size_t)pcVar9);
                  pcVar9 = (char *)__ptr;
                }
                pVVar11->pArray = ppvVar5;
                pVVar11->nCap = uVar1 * 2;
              }
            }
            else {
              ppvVar5 = pVVar11->pArray;
            }
LAB_006256d5:
            local_74 = local_74 + 1;
            iVar8 = *piVar10;
            *piVar10 = iVar8 + 1;
            ppvVar5[iVar8] = pvVar3;
          }
          else {
            iVar8 = Saig_ManFilterUsingIndOne2
                              ((Aig_Man_t *)pcVar9,p_00,pSat,(Cnf_Dat_t *)p_01,nConfs,in_R9D,Counter
                               ,1);
            if ((iVar8 == 1) &&
               (iVar8 = Saig_ManFilterUsingIndOne2
                                  ((Aig_Man_t *)pcVar9,p_00,pSat,(Cnf_Dat_t *)p_01,nConfs,in_R9D,
                                   Counter,2), iVar8 == -1)) {
              if (fVerbose != 0) {
                pcVar9 = "!";
                if (((ulong)pvVar3 & 1) == 0) {
                  pcVar9 = "";
                }
                printf("%d:%s%d  \n",0,pcVar9,
                       (ulong)*(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 0x24));
              }
              pcVar7 = "!";
              if (((ulong)pvVar3 & 1) == 0) {
                pcVar7 = "";
              }
              pcVar9 = " type II: %d:%s%d  \n";
              printf(" type II: %d:%s%d  \n",0,pcVar7,
                     (ulong)*(uint *)(((ulong)pvVar3 & 0xfffffffffffffffe) + 0x24));
              if (((int)local_74 < 0) || (*(int *)((long)pvVar2 + 4) <= (int)local_74))
              goto LAB_00625764;
              *(void **)(*(long *)((long)pvVar2 + 8) + (ulong)local_74 * 8) = pvVar3;
              pVVar11 = p->unfold2_type_II;
              piVar10 = &pVVar11->nSize;
              uVar1 = pVVar11->nSize;
              if (uVar1 == pVVar11->nCap) goto LAB_00625663;
              ppvVar5 = pVVar11->pArray;
              goto LAB_006256d5;
            }
          }
          lVar6 = lVar6 + 1;
          iVar8 = *(int *)((long)pvVar2 + 4);
        } while (lVar6 < iVar8);
        local_64 = local_64 + (int)lVar6;
      }
      if (iVar8 < (int)local_74) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
      }
      *(uint *)((long)pvVar2 + 4) = local_74;
      lVar6 = 1;
      bVar4 = false;
    } while (1 < vCands->nSize);
  }
  Cnf_DataFree((Cnf_Dat_t *)p_01);
  sat_solver_delete(pSat);
  if (fVerbose != 0) {
    Aig_ManPrintStats(p_00);
  }
  Aig_ManStop(p_00);
  return;
}

Assistant:

void Saig_ManFilterUsingInd2( Aig_Man_t * p, Vec_Vec_t * vCands, int nConfs, int nProps, int fVerbose )
{
  Vec_Ptr_t * vNodes;
  Aig_Man_t * pFrames;
  sat_solver * pSat;
  Cnf_Dat_t * pCnf;
  Aig_Obj_t * pObj;
  int i, k, k2, Counter;
  /*
    Vec_VecForEachLevel( vCands, vNodes, i )
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
    printf( "%d ", Aig_ObjId(Aig_Regular(pObj)) );
    printf( "\n" );
  */
  // create timeframes 
  //    pFrames = Saig_ManUnrollInd( p );
  pFrames = Saig_ManCreateIndMiter2( p, vCands );
  assert( Aig_ManCoNum(pFrames) == Vec_VecSizeSize(vCands)*3 );
  // start the SAT solver
  pCnf = Cnf_DeriveSimple( pFrames, Aig_ManCoNum(pFrames) );
  pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
  // check candidates
  if ( fVerbose )
    printf( "Filtered cands:  \n" );
  Counter = 0;
  Vec_VecForEachLevel( vCands, vNodes, i )
    {
      assert(i==0);             /* only one item */
      k2 = 0;
      Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
          if ( Saig_ManFilterUsingIndOne2( p, pFrames, pSat, pCnf, nConfs, nProps, Counter++ , 0) == l_False)
            //            if ( Saig_ManFilterUsingIndOne_old( p, pSat, pCnf, nConfs, pObj ) )
            {
              Vec_PtrWriteEntry( vNodes, k2++, pObj );
              if ( fVerbose )
                printf( "%d:%s%d \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
              printf( " type I : %d:%s%d \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
              Vec_PtrPush(p->unfold2_type_I, pObj);
            }
          /* jlong -- begin  */
          else if ( Saig_ManFilterUsingIndOne2( p, pFrames, pSat, pCnf, nConfs, nProps, Counter-1 , 1) == l_True ) /* can be self-conflicting */
            {
              if ( Saig_ManFilterUsingIndOne2( p, pFrames, pSat, pCnf, nConfs, nProps, Counter-1 , 2) == l_False ){
                //Vec_PtrWriteEntry( vNodes, k2++, pObj );
                if ( fVerbose )
                  printf( "%d:%s%d  \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                printf( " type II: %d:%s%d  \n", i, Aig_IsComplement(pObj)? "!":"", Aig_ObjId(Aig_Regular(pObj)) );
                Vec_PtrWriteEntry( vNodes, k2++, pObj ); /* add type II constraints */
                Vec_PtrPush(p->unfold2_type_II, pObj);
              }
            }
          /* jlong -- end  */
        }
      Vec_PtrShrink( vNodes, k2 );
    }

  // clean up
  Cnf_DataFree( pCnf );
  sat_solver_delete( pSat );
  if ( fVerbose )
    Aig_ManPrintStats( pFrames );
  Aig_ManStop( pFrames );
}